

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

void Rml::LogMissingFontFace(Element *element)

{
  uint uVar1;
  ComputedValues *pCVar2;
  String font_face_description;
  String local_50;
  String font_family_property;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&font_face_description,"font-family",(allocator<char> *)&local_50);
  Element::GetProperty<std::__cxx11::string>(&font_family_property,element,&font_face_description);
  ::std::__cxx11::string::~string((string *)&font_face_description);
  if (font_family_property._M_string_length == 0) {
    Element::GetAddress_abi_cxx11_(&font_face_description,element,false,true);
    Log::Message(LT_WARNING,"No font face defined. Missing \'font-family\' property. On element %s",
                 font_face_description._M_dataplus._M_p);
  }
  else {
    pCVar2 = Element::GetComputedValues(element);
    uVar1 = *(uint *)&(pCVar2->inherited).field_0x14;
    GetFontFaceDescription
              (&font_face_description,&font_family_property,(FontStyle)(uVar1 >> 0xb) & Italic,
               (FontWeight)uVar1 & 0x3ff);
    Element::GetAddress_abi_cxx11_(&local_50,element,false,true);
    Log::Message(LT_WARNING,
                 "No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, and (2) that the specified font face %s has been successfully loaded. Please see previous log messages for all successfully loaded fonts. On element %s"
                 ,font_face_description._M_dataplus._M_p,local_50._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::~string((string *)&font_face_description);
  ::std::__cxx11::string::~string((string *)&font_family_property);
  return;
}

Assistant:

void LogMissingFontFace(Element* element)
{
	const String font_family_property = element->GetProperty<String>("font-family");
	if (font_family_property.empty())
	{
		Log::Message(Log::LT_WARNING, "No font face defined. Missing 'font-family' property. On element %s", element->GetAddress().c_str());
	}
	else
	{
		const ComputedValues& computed = element->GetComputedValues();
		const String font_face_description = GetFontFaceDescription(font_family_property, computed.font_style(), computed.font_weight());
		Log::Message(Log::LT_WARNING,
			"No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, "
			"and (2) that the specified font face %s has been successfully loaded. "
			"Please see previous log messages for all successfully loaded fonts. On element %s",
			font_face_description.c_str(), element->GetAddress().c_str());
	}
}